

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O3

TermList ApplicativeHelper::createAppTerm
                   (TermList sort,TermList head,TermList *args,uint arity,bool shared)

{
  TermList s2;
  ulong uVar1;
  TermList res;
  ulong uVar2;
  
  if (arity != 0) {
    uVar2 = 0;
    do {
      uVar1 = (ulong)(*(uint *)(sort._content + 0xc) & 0xfffffff);
      s2._content = *(uint64_t *)(sort._content + 0x20 + uVar1 * 8);
      head = createAppTerm(*(uint64_t *)(sort._content + 0x28 + uVar1 * 8),s2,head,
                           args[uVar2]._content,shared);
      uVar2 = uVar2 + 1;
      sort._content = s2._content;
    } while (arity != uVar2);
  }
  return (TermList)head._content;
}

Assistant:

TermList ApplicativeHelper::createAppTerm(TermList sort, TermList head, TermList* args, unsigned arity, bool shared)
{
  ASS_REP(head.isVar() || SortHelper::getResultSort(head.term()) == sort, sort.toString() );

  TermList res = head;
  TermList s1, s2;

  for(unsigned i = 0; i < arity; i++){
    s1 = getNthArg(sort, 1);
    s2 = getResultApplieadToNArgs(sort, 1);
    res = createAppTerm(s1, s2, res, args[i], shared);
    sort = s2;
  }
  return res; 
}